

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessEnergy
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  bool bVar1;
  int iVar2;
  element_type *this_00;
  Value *pVVar3;
  size_type sVar4;
  const_reference pvVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EnergyReport *aEnergyReport;
  EnergyReportMap *aEnergyReportMap;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar7;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  anon_class_1_0_00000001 local_912;
  v10 local_911;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_910;
  char *local_908;
  string local_900;
  Error local_8e0;
  Value local_8b8;
  byte local_86a;
  allocator local_869;
  string local_868;
  Value local_848;
  undefined1 local_800 [8];
  EnergyReportMap reports;
  string local_7c8;
  Value local_7a8;
  ErrorCode local_75c;
  Error local_758;
  Value local_730;
  undefined1 local_6e8 [8];
  Address dstAddr;
  EnergyReport *report;
  string local_6c0;
  ErrorCode local_69c;
  Error local_698;
  Value local_670;
  ErrorCode local_624;
  Error local_620;
  Value local_5f8;
  ErrorCode local_5ac;
  Error local_5a8;
  Value local_580;
  ErrorCode local_534;
  Error local_530;
  Value local_508;
  ErrorCode local_4bc;
  Error local_4b8;
  Value local_490;
  anon_class_1_0_00000001 local_442;
  v10 local_441;
  v10 *local_440;
  size_t local_438;
  string local_430;
  Error local_410;
  Value local_3e8;
  ushort local_39e;
  ushort local_39c;
  byte local_399;
  uint uStack_398;
  uint16_t scanDuration;
  uint16_t period;
  uint8_t count;
  uint32_t channelMask;
  anon_class_1_0_00000001 local_36a;
  v10 local_369;
  v10 *local_368;
  size_t local_360;
  string local_358;
  Error local_338;
  Value local_310;
  ErrorCode local_2c8 [4];
  Error local_2b8;
  Value local_290;
  undefined1 local_248 [8];
  CommissionerAppPtr commissioner;
  Expression *aExpr_local;
  Interpreter *this_local;
  Value *value;
  undefined1 local_200 [16];
  v10 *local_1f0;
  ulong local_1e8;
  v10 *local_1e0;
  size_t sStack_1d8;
  string *local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1c8 [3];
  undefined1 local_1b0 [16];
  v10 *local_1a0;
  ulong local_198;
  v10 *local_190;
  size_t sStack_188;
  string *local_180;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_178 [3];
  undefined1 local_160 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  char *local_148;
  const_reference local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_138;
  char *pcStack_130;
  string *local_128;
  v10 *local_120;
  v10 **local_118;
  v10 *local_110;
  v10 **local_108;
  v10 *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_f8;
  v10 **local_f0;
  v10 *local_e8;
  size_t sStack_e0;
  v10 **local_d0;
  v10 *local_c8;
  size_t sStack_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b0;
  undefined1 *local_a8;
  Value **local_a0;
  undefined1 *local_98;
  Value **local_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_88;
  Value **local_80;
  undefined8 local_78;
  undefined1 *local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_10;
  
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0;
  Value::Value(__return_storage_ptr__);
  std::shared_ptr<ot::commissioner::CommissionerApp>::shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_248,(nullptr_t)0x0);
  this_00 = std::
            __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mJobManager);
  JobManager::GetSelectedCommissioner(&local_2b8,this_00,(CommissionerAppPtr *)local_248);
  Value::Value(&local_290,&local_2b8);
  pVVar3 = Value::operator=(__return_storage_ptr__,&local_290);
  local_2c8[0] = kNone;
  bVar1 = Value::operator!=(pVVar3,local_2c8);
  Value::~Value(&local_290);
  Error::~Error(&local_2b8);
  if (!bVar1) {
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(aExpr);
    if (sVar4 < 2) {
      ProcessEnergy::anon_class_1_0_00000001::operator()(&local_36a);
      local_118 = &local_368;
      local_120 = &local_369;
      bVar7 = ::fmt::v10::operator()(local_120);
      local_360 = bVar7.size_;
      local_368 = (v10 *)bVar7.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_180 = &local_358;
      local_190 = local_368;
      sStack_188 = local_360;
      local_f0 = &local_190;
      local_1a0 = local_368;
      local_198 = local_360;
      local_e8 = local_1a0;
      sStack_e0 = local_198;
      local_1c8[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_a8 = local_1b0;
      local_b0 = local_1c8;
      local_60 = 0;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_b0;
      fmt.size_ = 0;
      fmt.data_ = (char *)local_198;
      local_88 = local_b0;
      local_68 = local_b0;
      local_58 = local_a8;
      ::fmt::v10::vformat_abi_cxx11_(&local_358,local_1a0,fmt,args);
      Error::Error(&local_338,kInvalidArgs,&local_358);
      Value::Value(&local_310,&local_338);
      Value::operator=(__return_storage_ptr__,&local_310);
      Value::~Value(&local_310);
      Error::~Error(&local_338);
      std::__cxx11::string::~string((string *)&local_358);
    }
    else {
      pvVar5 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](aExpr,1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&channelMask,"scan",(allocator *)&count);
      bVar1 = CaseInsensitiveEqual(pvVar5,(string *)&channelMask);
      std::__cxx11::string::~string((string *)&channelMask);
      std::allocator<char>::~allocator((allocator<char> *)&count);
      if (bVar1) {
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(aExpr);
        if (sVar4 < 7) {
          ProcessEnergy::anon_class_1_0_00000001::operator()(&local_442);
          local_108 = &local_440;
          local_110 = &local_441;
          bVar7 = ::fmt::v10::operator()(local_110);
          local_438 = bVar7.size_;
          local_440 = (v10 *)bVar7.data_;
          ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
          local_1d0 = &local_430;
          local_1e0 = local_440;
          sStack_1d8 = local_438;
          local_d0 = &local_1e0;
          local_1f0 = local_440;
          local_1e8 = local_438;
          local_c8 = local_1f0;
          sStack_c0 = local_1e8;
          value = (Value *)::fmt::v10::
                           make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                     ();
          local_98 = local_200;
          local_a0 = &value;
          local_78 = 0;
          args_00.field_1.values_ = in_R9.values_;
          args_00.desc_ = (unsigned_long_long)local_a0;
          fmt_00.size_ = 0;
          fmt_00.data_ = (char *)local_1e8;
          local_90 = local_a0;
          local_80 = local_a0;
          local_70 = local_98;
          ::fmt::v10::vformat_abi_cxx11_(&local_430,local_1f0,fmt_00,args_00);
          Error::Error(&local_410,kInvalidArgs,&local_430);
          Value::Value(&local_3e8,&local_410);
          Value::operator=(__return_storage_ptr__,&local_3e8);
          Value::~Value(&local_3e8);
          Error::~Error(&local_410);
          std::__cxx11::string::~string((string *)&local_430);
        }
        else {
          pvVar5 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](aExpr,2);
          utils::ParseInteger<unsigned_int>(&local_4b8,&stack0xfffffffffffffc68,pvVar5);
          Value::Value(&local_490,&local_4b8);
          pVVar3 = Value::operator=(__return_storage_ptr__,&local_490);
          local_4bc = kNone;
          bVar1 = Value::operator!=(pVVar3,&local_4bc);
          Value::~Value(&local_490);
          Error::~Error(&local_4b8);
          if (!bVar1) {
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](aExpr,3);
            utils::ParseInteger<unsigned_char>(&local_530,&local_399,pvVar5);
            Value::Value(&local_508,&local_530);
            pVVar3 = Value::operator=(__return_storage_ptr__,&local_508);
            local_534 = kNone;
            bVar1 = Value::operator!=(pVVar3,&local_534);
            Value::~Value(&local_508);
            Error::~Error(&local_530);
            if (!bVar1) {
              pvVar5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](aExpr,4);
              utils::ParseInteger<unsigned_short>(&local_5a8,&local_39c,pvVar5);
              Value::Value(&local_580,&local_5a8);
              pVVar3 = Value::operator=(__return_storage_ptr__,&local_580);
              local_5ac = kNone;
              bVar1 = Value::operator!=(pVVar3,&local_5ac);
              Value::~Value(&local_580);
              Error::~Error(&local_5a8);
              if (!bVar1) {
                pvVar5 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::operator[](aExpr,5);
                utils::ParseInteger<unsigned_short>(&local_620,&local_39e,pvVar5);
                Value::Value(&local_5f8,&local_620);
                pVVar3 = Value::operator=(__return_storage_ptr__,&local_5f8);
                local_624 = kNone;
                bVar1 = Value::operator!=(pVVar3,&local_624);
                Value::~Value(&local_5f8);
                Error::~Error(&local_620);
                if (!bVar1) {
                  peVar6 = std::
                           __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_248);
                  pvVar5 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::operator[](aExpr,6);
                  (*(peVar6->super_CommissionerHandler)._vptr_CommissionerHandler[0x48])
                            (&local_698,peVar6,(ulong)uStack_398,(ulong)local_399,(ulong)local_39c,
                             (ulong)local_39e,pvVar5);
                  Value::Value(&local_670,&local_698);
                  pVVar3 = Value::operator=(__return_storage_ptr__,&local_670);
                  local_69c = kNone;
                  Value::operator!=(pVVar3,&local_69c);
                  Value::~Value(&local_670);
                  Error::~Error(&local_698);
                }
              }
            }
          }
        }
      }
      else {
        pvVar5 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](aExpr,1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_6c0,"report",(allocator *)((long)&report + 7))
        ;
        bVar1 = CaseInsensitiveEqual(pvVar5,&local_6c0);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::allocator<char>::~allocator((allocator<char> *)((long)&report + 7));
        if (bVar1) {
          sVar4 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size(aExpr);
          if (sVar4 < 3) {
            peVar6 = std::
                     __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_248);
            iVar2 = (*(peVar6->super_CommissionerHandler)._vptr_CommissionerHandler[0x4a])();
            std::
            map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
            ::map((map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
                   *)local_800,
                  (map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
                   *)CONCAT44(extraout_var_00,iVar2));
            bVar1 = std::
                    map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
                    ::empty((map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
                             *)local_800);
            local_86a = 0;
            if (bVar1) {
              std::allocator<char>::allocator();
              local_86a = 1;
              std::__cxx11::string::string((string *)&local_868,"null",&local_869);
            }
            else {
              EnergyReportMapToJson_abi_cxx11_
                        (&local_868,(commissioner *)local_800,aEnergyReportMap);
            }
            Value::Value(&local_848,&local_868);
            Value::operator=(__return_storage_ptr__,&local_848);
            Value::~Value(&local_848);
            std::__cxx11::string::~string((string *)&local_868);
            if ((local_86a & 1) != 0) {
              std::allocator<char>::~allocator((allocator<char> *)&local_869);
            }
            std::
            map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
            ::~map((map<ot::commissioner::Address,_ot::commissioner::EnergyReport,_std::less<ot::commissioner::Address>,_std::allocator<std::pair<const_ot::commissioner::Address,_ot::commissioner::EnergyReport>_>_>
                    *)local_800);
          }
          else {
            dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            Address::Address((Address *)local_6e8);
            pvVar5 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](aExpr,2);
            Address::Set(&local_758,(Address *)local_6e8,pvVar5);
            Value::Value(&local_730,&local_758);
            pVVar3 = Value::operator=(__return_storage_ptr__,&local_730);
            local_75c = kNone;
            bVar1 = Value::operator!=(pVVar3,&local_75c);
            Value::~Value(&local_730);
            Error::~Error(&local_758);
            if (bVar1) {
              reports._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 4;
            }
            else {
              peVar6 = std::
                       __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_248);
              iVar2 = (*(peVar6->super_CommissionerHandler)._vptr_CommissionerHandler[0x49])
                                (peVar6,local_6e8);
              dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)CONCAT44(extraout_var,iVar2);
              reports._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
              if ((commissioner *)
                  dstAddr.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage == (commissioner *)0x0) {
                std::allocator<char>::allocator();
                reports._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
                std::__cxx11::string::string
                          ((string *)&local_7c8,"null",
                           (allocator *)
                           ((long)&reports._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
              }
              else {
                EnergyReportToJson_abi_cxx11_
                          (&local_7c8,
                           (commissioner *)
                           dstAddr.mBytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,aEnergyReport);
              }
              Value::Value(&local_7a8,&local_7c8);
              Value::operator=(__return_storage_ptr__,&local_7a8);
              Value::~Value(&local_7a8);
              std::__cxx11::string::~string((string *)&local_7c8);
              if ((reports._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ & 1) != 0) {
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&reports._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
              }
              reports._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 0;
            }
            Address::~Address((Address *)local_6e8);
            if (((int)reports._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
               ((int)reports._M_t._M_impl.super__Rb_tree_header._M_node_count != 4))
            goto LAB_001378d3;
          }
        }
        else {
          ProcessEnergy::anon_class_1_0_00000001::operator()(&local_912);
          local_f8 = &local_910;
          local_100 = &local_911;
          bVar7 = ::fmt::v10::operator()(local_100);
          local_908 = (char *)bVar7.size_;
          local_910 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      bVar7.data_;
          ::fmt::v10::detail::
          check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                    ();
          local_140 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](aExpr,1);
          local_128 = &local_900;
          local_138 = local_910;
          pcStack_130 = local_908;
          local_50 = &local_138;
          local_150 = local_910;
          local_148 = local_908;
          local_48 = local_150;
          pcStack_40 = local_148;
          local_178[0] = ::fmt::v10::
                         make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                                   ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)local_140,(v10 *)local_128,local_910);
          local_30 = local_160;
          local_38 = local_178;
          local_20 = 0xd;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)local_38;
          fmt_01.size_ = 0xd;
          fmt_01.data_ = local_148;
          local_28 = local_38;
          local_18 = local_30;
          local_10 = local_38;
          ::fmt::v10::vformat_abi_cxx11_(&local_900,(v10 *)local_150,fmt_01,args_01);
          Error::Error(&local_8e0,kInvalidCommand,&local_900);
          Value::Value(&local_8b8,&local_8e0);
          Value::operator=(__return_storage_ptr__,&local_8b8);
          Value::~Value(&local_8b8);
          Error::~Error(&local_8e0);
          std::__cxx11::string::~string((string *)&local_900);
        }
      }
    }
  }
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 1;
  reports._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
LAB_001378d3:
  std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_248);
  if ((commissioner.
       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi._7_1_ & 1) == 0) {
    Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessEnergy(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "scan"))
    {
        uint32_t channelMask;
        uint8_t  count;
        uint16_t period;
        uint16_t scanDuration;
        VerifyOrExit(aExpr.size() >= 7, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = ParseInteger(channelMask, aExpr[2]));
        SuccessOrExit(value = ParseInteger(count, aExpr[3]));
        SuccessOrExit(value = ParseInteger(period, aExpr[4]));
        SuccessOrExit(value = ParseInteger(scanDuration, aExpr[5]));
        SuccessOrExit(value = commissioner->EnergyScan(channelMask, count, period, scanDuration, aExpr[6]));
    }
    else if (CaseInsensitiveEqual(aExpr[1], "report"))
    {
        if (aExpr.size() >= 3)
        {
            const EnergyReport *report = nullptr;
            Address             dstAddr;
            SuccessOrExit(value = dstAddr.Set(aExpr[2]));
            report = commissioner->GetEnergyReport(dstAddr);
            value  = report == nullptr ? "null" : EnergyReportToJson(*report);
        }
        else
        {
            auto reports = commissioner->GetAllEnergyReports();
            value        = reports.empty() ? "null" : EnergyReportMapToJson(reports);
        }
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}